

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  undefined4 magFilter_00;
  undefined4 internalFormat;
  void *pvVar1;
  char *pcVar2;
  Texture2DRenderCase *this_00;
  char *description;
  Matrix<float,_3,_3> local_3d0;
  allocator<char> local_3a9;
  string local_3a8 [8];
  string descriptionBase;
  int numTextures;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  allocator<char> local_361;
  string local_360 [8];
  string nameBase;
  deUint32 format;
  int formatNdx;
  anon_struct_16_2_e82303c2 texFormats [49];
  TextureFormatTests *this_local;
  
  pvVar1 = memcpy(&format,&PTR_anon_var_dwarf_1dff3d_015ae910,0x310);
  nameBase.field_2._12_4_ = 0;
  while ((int)nameBase.field_2._12_4_ < 0x31) {
    nameBase.field_2._8_4_ = *(undefined4 *)&texFormats[(int)nameBase.field_2._12_4_].name;
    pcVar2 = *(char **)(&format + (long)(int)nameBase.field_2._12_4_ * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_360,pcVar2,&local_361);
    std::allocator<char>::~allocator(&local_361);
    descriptionBase.field_2._12_4_ = 0x2600;
    descriptionBase.field_2._8_4_ = 1;
    pcVar2 = glu::getTextureFormatName(nameBase.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3a8,pcVar2,&local_3a9);
    std::allocator<char>::~allocator(&local_3a9);
    this_00 = (Texture2DRenderCase *)operator_new(0x218);
    context = (this->super_TestCaseGroup).m_context;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    description = (char *)std::__cxx11::string::c_str();
    internalFormat = nameBase.field_2._8_4_;
    magFilter_00 = descriptionBase.field_2._12_4_;
    tcu::Matrix<float,_3,_3>::Matrix(&local_3d0);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,pcVar2,description,internalFormat,0x812f,0x812f,0x2600,magFilter_00,
               &local_3d0,descriptionBase.field_2._8_4_,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    tcu::Matrix<float,_3,_3>::~Matrix(&local_3d0);
    std::__cxx11::string::~string(local_3a8);
    std::__cxx11::string::~string(local_360);
    nameBase.field_2._12_4_ = nameBase.field_2._12_4_ + 1;
    pvVar1 = (void *)(ulong)(uint)nameBase.field_2._12_4_;
  }
  return (int)pvVar1;
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].internalFormat;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= glu::getTextureFormatName(format);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}